

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  uint uVar1;
  U32 UVar2;
  ZSTD_window_t *in_RCX;
  ZSTD_CCtx_params *in_RDX;
  ZSTD_cwksp *in_RSI;
  ZSTD_matchState_t *in_RDI;
  void *in_R8;
  int in_R9D;
  undefined4 unaff_retaddr;
  U32 unaff_retaddr_00;
  size_t err_code_1;
  size_t cSize;
  size_t err_code;
  size_t fhSize;
  ZSTD_matchState_t *ms;
  ZSTD_CCtx_params *local_68;
  ZSTD_CCtx_params *local_48;
  uint **ppuVar3;
  undefined4 in_stack_ffffffffffffffc8;
  ZSTD_CCtx_params *in_stack_fffffffffffffff8;
  
  ppuVar3 = &in_RDI[10].opt.litLengthFreq;
  local_48 = (ZSTD_CCtx_params *)0x0;
  if (*(int *)&(in_RDI->window).nextSrc == 0) {
    local_68 = (ZSTD_CCtx_params *)0xffffffffffffffc4;
  }
  else {
    if ((in_R9D != 0) && (*(int *)&(in_RDI->window).nextSrc == 1)) {
      local_48 = (ZSTD_CCtx_params *)
                 ZSTD_writeFrameHeader
                           ((void *)err_code_1,CONCAT44(unaff_retaddr_00,unaff_retaddr),
                            in_stack_fffffffffffffff8,(U64)in_RDI,(U32)((ulong)in_RSI >> 0x20));
      uVar1 = ERR_isError((size_t)local_48);
      if (uVar1 != 0) {
        return (size_t)local_48;
      }
      if (in_RDX < local_48) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x62a6,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      in_RDX = (ZSTD_CCtx_params *)((long)in_RDX - (long)local_48);
      in_RSI = (ZSTD_cwksp *)((long)&local_48->format + (long)&in_RSI->workspace);
      *(undefined4 *)&(in_RDI->window).nextSrc = 2;
    }
    local_68 = local_48;
    if (in_R8 != (void *)0x0) {
      UVar2 = ZSTD_window_update(in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                                 (int)((ulong)ppuVar3 >> 0x20));
      if (UVar2 == 0) {
        *(undefined4 *)(ppuVar3 + 0x11) = 0;
        *(U32 *)((long)ppuVar3 + 0x2c) = *(U32 *)(ppuVar3 + 3);
      }
      if (*(int *)&in_RDI[1].window.dictBase == 1) {
        ZSTD_window_update(in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                           (int)((ulong)ppuVar3 >> 0x20));
      }
      if (in_R9D == 0) {
        ZSTD_overflowCorrectIfNeeded(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
      }
      if (in_R9D == 0) {
        local_68 = (ZSTD_CCtx_params *)
                   ZSTD_compressBlock_internal
                             ((ZSTD_CCtx *)err_code_1,
                              (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                              (size_t)in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI,
                              (U32)((ulong)in_RDX >> 0x20));
      }
      else {
        local_68 = (ZSTD_CCtx_params *)
                   ZSTD_compress_frameChunk
                             ((ZSTD_CCtx *)ms,(void *)fhSize,err_code,(void *)cSize,err_code_1,
                              unaff_retaddr_00);
      }
      uVar1 = ERR_isError((size_t)local_68);
      if (uVar1 == 0) {
        *(long *)&in_RDI[2].forceNonContiguous =
             (long)in_R8 + *(long *)&in_RDI[2].forceNonContiguous;
        in_RDI[2].opt.litFreq =
             (uint *)((long)&local_48->format +
                     (long)in_RDI[2].opt.litFreq + (long)&local_68->format);
        if (((in_RDI->cParams).windowLog != 0) && (in_RDI[2].chainTable == (U32 *)0x0)) {
          __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x62c4,
                        "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                       );
        }
        if ((in_RDI[2].chainTable == (U32 *)0x0) ||
           ((U32 *)(*(long *)&in_RDI[2].forceNonContiguous + 1U) <= in_RDI[2].chainTable)) {
          local_68 = (ZSTD_CCtx_params *)((long)&local_48->format + (long)&local_68->format);
        }
        else {
          local_68 = (ZSTD_CCtx_params *)0xffffffffffffffb8;
        }
      }
    }
  }
  return (size_t)local_68;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}